

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar7;
  LogFinisher local_59;
  LogMessage local_58;
  _Base_ptr p_Var6;
  
  local_58.filename_ = (char *)0x0;
  local_58.line_ = 0;
  local_58._20_4_ = 0;
  local_58.message_._M_dataplus._M_p = (pointer)0x0;
  local_58.level_ = number;
  pVar7 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_58);
  _Var4 = pVar7.first._M_node;
  _Var4._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var4._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1d6);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    bVar2 = *(byte *)&_Var4._M_node[1]._M_left;
    if ((byte)(bVar2 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1d6);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    bVar2 = *(byte *)((long)&_Var4._M_node[1]._M_left + 2);
    *(byte *)((long)&_Var4._M_node[1]._M_left + 2) = bVar2 & 0xf0;
    p_Var6 = _Var4._M_node[1]._M_parent;
    if ((bVar2 & 0x10) != 0) {
      iVar3 = (*(*(_func_int ***)p_Var6)[4])(p_Var6,prototype);
      p_Var6 = (_Base_ptr)CONCAT44(extraout_var_00,iVar3);
    }
  }
  else {
    *(FieldType *)&_Var4._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x35);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                 ,0x1cf);
      pLVar5 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_58);
    }
    *(undefined1 *)((long)&_Var4._M_node[1]._M_left + 1) = 0;
    pbVar1 = (byte *)((long)&_Var4._M_node[1]._M_left + 2);
    *pbVar1 = *pbVar1 & 0xf;
    iVar3 = (*prototype->_vptr_MessageLite[3])(prototype);
    p_Var6 = (_Base_ptr)CONCAT44(extraout_var,iVar3);
    _Var4._M_node[1]._M_parent = p_Var6;
    pbVar1 = (byte *)((long)&_Var4._M_node[1]._M_left + 2);
    *pbVar1 = *pbVar1 & 0xf0;
  }
  return (MessageLite *)p_Var6;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New();
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype);
    } else {
      return extension->message_value;
    }
  }
}